

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,3>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined8 *puVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_3>_> *pVVar5;
  pointer pcVar6;
  Variable<tcu::Matrix<float,_3,_3>_> *pVVar7;
  undefined8 uVar8;
  PrecisionCase *pPVar9;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar10;
  bool bVar11;
  ContextType type;
  int iVar12;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  char *__s;
  size_t sVar15;
  long *plVar16;
  ShaderExecutor *pSVar17;
  long lVar18;
  IVal *pIVar19;
  IVal *pIVar20;
  MessageBuilder *pMVar21;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  undefined1 *puVar23;
  Vector<float,_3> *pVVar24;
  FloatFormat *fmt;
  long lVar25;
  double dVar26;
  byte bVar27;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  ostringstream os;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  ostringstream oss;
  PrecisionCase *local_4f8;
  undefined1 local_4f0 [12];
  undefined4 uStack_4e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4d0;
  IVal local_4c1;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4c0;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [24];
  double local_490;
  double local_470;
  Statement *local_468;
  ulong local_460;
  string local_458;
  double local_438;
  ResultCollector *local_430;
  undefined1 local_428 [8];
  pointer pVStack_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  double local_408;
  Data local_400;
  undefined4 local_3f0;
  ios_base local_3b8 [8];
  ios_base local_3b0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2a8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_278;
  FloatFormat local_248;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar27 = 0;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_470 = (double)(((long)pVVar4 - (long)pVVar3 >> 2) * -0x5555555555555555);
  local_4d0 = variables;
  local_4c0 = inputs;
  local_468 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_278,(size_t)local_470);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_248.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_248.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_248.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_248.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_248.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_248.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_248.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_248.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_248._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_428 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_420);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"Statement: ",0xb);
  (*local_468->_vptr_Statement[2])(local_468,(ostringstream *)&pVStack_420);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4f8 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_420);
  std::ios_base::~ios_base(local_3b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_4b8 + 8);
  local_4b8._8_4_ = _S_red;
  local_4a8._0_8_ = (_Base_ptr)0x0;
  local_490 = 0.0;
  local_4a8._8_8_ = p_Var2;
  local_4a8._16_8_ = p_Var2;
  (*local_468->_vptr_Statement[4])(local_468,local_4b8);
  if ((_Rb_tree_node_base *)local_4a8._8_8_ != p_Var2) {
    p_Var14 = (_Rb_tree_node_base *)local_4a8._8_8_;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_1a8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var2);
  }
  pPVar9 = local_4f8;
  if (local_490 != 0.0) {
    local_428 = (undefined1  [8])((local_4f8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_420);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_420,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_420,(char *)local_4f0._0_8_,CONCAT44(uStack_4e4,local_4f0._8_4_))
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._0_8_ != &local_4e0) {
      operator_delete((void *)local_4f0._0_8_,local_4e0._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_420);
    std::ios_base::~ios_base(local_3b0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,"precision ",10);
  __s = glu::getPrecisionName((pPVar9->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)((long)&local_4f8 + *(long *)((long)local_428 + -0x18)) + 0xd0);
  }
  else {
    sVar15 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,__s,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
  std::ios_base::~ios_base(local_3b8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_4f8->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_4f8->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_4f8->m_extension);
    plVar16 = (long *)std::__cxx11::string::append(local_1a8);
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar22) {
      local_418._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_418._8_8_ = plVar16[3];
      local_428 = (undefined1  [8])&local_418;
    }
    else {
      local_418._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_428 = (undefined1  [8])*plVar16;
    }
    pVStack_420 = (pointer)plVar16[1];
    *plVar16 = (long)paVar22;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_428);
    if (local_428 != (undefined1  [8])&local_418) {
      operator_delete((void *)local_428,local_418._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_428,local_4f8,
             (local_4d0->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar8 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_428);
  glu::VarType::operator=(&((pointer)(uVar8 + 0x38))->varType,(VarType *)&local_408);
  glu::VarType::~VarType((VarType *)&local_408);
  if (local_428 != (undefined1  [8])&local_418) {
    operator_delete((void *)local_428,local_418._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_428,local_4f8,
             (local_4d0->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar8 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_428);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),(VarType *)&local_408);
  glu::VarType::~VarType((VarType *)&local_408);
  if (local_428 != (undefined1  [8])&local_418) {
    operator_delete((void *)local_428,local_418._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<tcu::Matrix<float,3,3>>
            ((Symbol *)local_428,local_4f8,
             (local_4d0->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
             .m_ptr);
  uVar8 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_428);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),(VarType *)&local_408);
  glu::VarType::~VarType((VarType *)&local_408);
  if (local_428 != (undefined1  [8])&local_418) {
    operator_delete((void *)local_428,local_418._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
  (*local_468->_vptr_Statement[2])(local_468,local_428);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
  std::ios_base::~ios_base(local_3b8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar9 = local_4f8;
  pSVar17 = ShaderExecUtil::createExecutor
                      ((local_4f8->m_ctx).renderContext,(local_4f8->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_428 = (undefined1  [8])
              (local_4c0->in0).
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pVStack_420 = (local_4c0->in1).
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_418._M_allocated_capacity =
       (size_type)
       (local_4c0->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_418._8_8_ =
       (local_4c0->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_278.out0.
       super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_278.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar17->_vptr_ShaderExecutor[3])
            (pSVar17,((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar12 = (*pSVar17->_vptr_ShaderExecutor[2])(pSVar17);
  if ((char)iVar12 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar17->_vptr_ShaderExecutor[5])(pSVar17);
  (*pSVar17->_vptr_ShaderExecutor[6])(pSVar17,local_470,local_428,local_1a8);
  fmt = &(pPVar9->m_ctx).floatFormat;
  (*pSVar17->_vptr_ShaderExecutor[1])(pSVar17);
  lVar18 = 8;
  do {
    local_1a8[lVar18 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  lVar18 = 8;
  do {
    local_1a8[lVar18 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  lVar18 = 8;
  do {
    *(undefined1 *)((long)&local_4c0 + lVar18) = 0;
    *(undefined8 *)(local_4b8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_4b8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  lVar18 = 8;
  do {
    *(undefined1 *)((long)&local_4c0 + lVar18) = 0;
    *(undefined8 *)(local_4b8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_4b8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_428);
  pVVar10 = local_4d0;
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2a8,
             (local_4d0->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2a8,
             (pVVar10->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_4b8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar10->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_4f0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar10->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_458);
  Environment::bind<tcu::Matrix<float,3,3>>
            ((Environment *)&local_2a8,
             (pVVar10->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
             .m_ptr,(IVal *)local_428);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar10->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_4c1);
  if (pVVar4 == pVVar3) {
LAB_0178b263:
    local_428 = (undefined1  [8])((local_4f8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_420);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_420);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_420," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_430 = &local_4f8->m_status;
    local_438 = (double)((long)local_470 + (ulong)(local_470 == 0.0));
    dVar26 = 0.0;
    local_460 = 0;
    do {
      tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_1a8);
      if (((ulong)dVar26 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_4f8->super_TestCase).super_TestNode.m_testCtx);
      }
      pVVar3 = (local_4c0->in0).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4f0._8_4_ = pVVar3[(long)dVar26].m_data[2];
      local_4f0._0_8_ = *(undefined8 *)pVVar3[(long)dVar26].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_4b8,fmt,(Vector<float,_3> *)local_4f0);
      pVVar10 = local_4d0;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_428,fmt,(IVal *)local_4b8);
      pIVar19 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2a8,
                           (pVVar10->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar21 = (MessageBuilder *)local_428;
      for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(TestLog **)pIVar19->m_data = pMVar21->m_log;
        pMVar21 = (MessageBuilder *)((long)pMVar21 + (ulong)bVar27 * -0x10 + 8);
        pIVar19 = (IVal *)((long)pIVar19 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      pVVar3 = (local_4c0->in1).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4f0._8_4_ = pVVar3[(long)dVar26].m_data[2];
      local_4f0._0_8_ = *(undefined8 *)pVVar3[(long)dVar26].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_4b8,fmt,(Vector<float,_3> *)local_4f0);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_428,fmt,(IVal *)local_4b8);
      pIVar19 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2a8,
                           (pVVar10->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar21 = (MessageBuilder *)local_428;
      for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(TestLog **)pIVar19->m_data = pMVar21->m_log;
        pMVar21 = (MessageBuilder *)((long)pMVar21 + (ulong)bVar27 * -0x10 + 8);
        pIVar19 = (IVal *)((long)pIVar19 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2a8,
                 (pVVar10->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2a8,
                 (pVVar10->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_400.basic.type = (local_4f8->m_ctx).precision;
      local_408 = (pPVar9->m_ctx).floatFormat.m_maxValue;
      local_428 = *(undefined1 (*) [8])fmt;
      pVStack_420 = *(pointer *)&(pPVar9->m_ctx).floatFormat.m_fractionBits;
      local_418._M_allocated_capacity = *(undefined8 *)&(pPVar9->m_ctx).floatFormat.m_hasInf;
      local_418._8_8_ = *(undefined8 *)&(pPVar9->m_ctx).floatFormat.m_exactPrecision;
      local_3f0 = 0;
      local_400._8_8_ = &local_2a8;
      (*local_468->_vptr_Statement[3])(local_468,(MessageBuilder *)local_428);
      pIVar20 = Environment::lookup<tcu::Matrix<float,3,3>>
                          ((Environment *)&local_2a8,
                           (pVVar10->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                ((IVal *)local_428,&local_248,pIVar20);
      puVar23 = local_1a8;
      lVar18 = 0;
      pMVar21 = (MessageBuilder *)local_428;
      do {
        lVar25 = 0;
        do {
          *(undefined8 *)(puVar23 + lVar25 + 0x10) =
               *(undefined8 *)
                (&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar25);
          puVar1 = (undefined8 *)((long)&pMVar21->m_log + lVar25);
          uVar8 = puVar1[1];
          *(undefined8 *)(puVar23 + lVar25) = *puVar1;
          *(undefined8 *)((long)(puVar23 + lVar25) + 8) = uVar8;
          lVar25 = lVar25 + 0x48;
        } while (lVar25 != 0xd8);
        lVar18 = lVar18 + 1;
        puVar23 = puVar23 + 0x18;
        pMVar21 = (MessageBuilder *)
                  &(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      } while (lVar18 != 3);
      bVar11 = contains<tcu::Matrix<float,3,3>>
                         ((IVal *)local_1a8,
                          local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)dVar26);
      local_428 = (undefined1  [8])&local_418;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_428,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(local_430,bVar11,(string *)local_428);
      if (local_428 != (undefined1  [8])&local_418) {
        operator_delete((void *)local_428,(ulong)(local_418._M_allocated_capacity + 1));
      }
      if (!bVar11) {
        uVar13 = (int)local_460 + 1;
        local_460 = (ulong)uVar13;
        if ((int)uVar13 < 0x65) {
          local_428 = (undefined1  [8])((local_4f8->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_420);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"\t",1);
          pVVar5 = (local_4d0->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pVVar24 = (Vector<float,_3> *)local_4a8;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_4b8._0_8_ = pVVar24;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4b8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_420,(char *)local_4b8._0_8_,
                     CONCAT44(local_4b8._12_4_,local_4b8._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_4f0,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     ((local_4c0->in0).
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar26),pVVar24);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_420,(char *)local_4f0._0_8_,
                     CONCAT44(uStack_4e4,local_4f0._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._0_8_ != &local_4e0) {
            operator_delete((void *)local_4f0._0_8_,local_4e0._M_allocated_capacity + 1);
          }
          if ((Vector<float,_3> *)local_4b8._0_8_ != (Vector<float,_3> *)local_4a8) {
            operator_delete((void *)local_4b8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4a8._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"\t",1);
          pVVar5 = (local_4d0->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pVVar24 = (Vector<float,_3> *)local_4a8;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_4b8._0_8_ = pVVar24;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4b8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_420,(char *)local_4b8._0_8_,
                     CONCAT44(local_4b8._12_4_,local_4b8._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_4f0,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     ((local_4c0->in1).
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar26),pVVar24);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_420,(char *)local_4f0._0_8_,
                     CONCAT44(uStack_4e4,local_4f0._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._0_8_ != &local_4e0) {
            operator_delete((void *)local_4f0._0_8_,local_4e0._M_allocated_capacity + 1);
          }
          if ((Vector<float,_3> *)local_4b8._0_8_ != (Vector<float,_3> *)local_4a8) {
            operator_delete((void *)local_4b8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4a8._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"\t",1);
          pVVar7 = (local_4d0->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_4a8;
          pcVar6 = (pVVar7->m_name)._M_dataplus._M_p;
          local_4b8._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4b8,pcVar6,pcVar6 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_420,(char *)local_4b8._0_8_,
                     CONCAT44(local_4b8._12_4_,local_4b8._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420," = ",3);
          valueToString<tcu::Matrix<float,3,3>>
                    ((string *)local_4f0,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     (local_278.out0.
                      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar26),
                     (Matrix<float,_3,_3> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_420,(char *)local_4f0._0_8_,
                     CONCAT44(uStack_4e4,local_4f0._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_420,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,3,3>>
                    (&local_458,(BuiltinPrecisionTests *)&local_248,(FloatFormat *)local_1a8,pIVar20
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_420,local_458._M_dataplus._M_p,local_458._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._0_8_ != &local_4e0) {
            operator_delete((void *)local_4f0._0_8_,local_4e0._M_allocated_capacity + 1);
          }
          if ((IVal *)local_4b8._0_8_ != (IVal *)local_4a8) {
            operator_delete((void *)local_4b8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4a8._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_420);
          std::ios_base::~ios_base(local_3b0);
        }
      }
      dVar26 = (double)((long)dVar26 + 1);
    } while (dVar26 != local_438);
    iVar12 = (int)local_460;
    if (iVar12 < 0x65) {
      if (iVar12 == 0) goto LAB_0178b263;
    }
    else {
      local_428 = (undefined1  [8])((local_4f8->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_420);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_420,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_420);
      std::ios_base::~ios_base(local_3b0);
    }
    local_428 = (undefined1  [8])((local_4f8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_420);
    std::ostream::operator<<((ostringstream *)&pVStack_420,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_420,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_420);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_420," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_420);
  std::ios_base::~ios_base(local_3b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_278.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.out0.
      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}